

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,4>,tcu::Vector<float,4>,tcu::Vector<float,4>,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,4>,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  _Rb_tree_node_base *p_Var1;
  ostringstream *poVar2;
  ostream *poVar3;
  pointer pVVar4;
  pointer pVVar5;
  Variable<tcu::Vector<float,_4>_> *pVVar6;
  pointer pcVar7;
  undefined7 uVar8;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar9;
  PrecisionCase *pPVar10;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pIVar11;
  undefined8 uVar12;
  bool bVar13;
  ContextType type;
  int iVar14;
  _Rb_tree_node_base *p_Var15;
  char *pcVar16;
  size_t sVar17;
  long *plVar18;
  ShaderExecutor *pSVar19;
  long lVar20;
  IVal *pIVar21;
  TestError *this_00;
  uint uVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  Vector<float,_4> *pVVar24;
  undefined8 *puVar25;
  IVal *pIVar26;
  ulong uVar27;
  byte bVar28;
  IVal reference1;
  FuncSet funcs;
  IVal reference0;
  ostringstream os;
  IVal in3;
  Environment env;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  ShaderSpec spec;
  ostringstream oss;
  FloatFormat highpFmt;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_578;
  pointer local_570;
  FloatFormat *local_568;
  undefined1 auStack_560 [7];
  IVal local_559;
  PrecisionCase *local_558;
  undefined1 local_550 [16];
  undefined1 local_540 [24];
  double local_528;
  double local_4f0;
  Statement *local_4e8;
  ulong local_4e0;
  undefined1 local_4d8 [96];
  undefined1 auStack_478 [8];
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_470;
  undefined1 local_468 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  double local_448;
  Data local_440;
  undefined4 local_430;
  ios_base local_3f8 [8];
  ios_base local_3f0 [272];
  string local_2e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2c0;
  ulong local_290;
  ResultCollector *local_288;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_280;
  undefined1 local_250 [56];
  _Alloc_hider local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  _Alloc_hider local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  undefined1 local_1d8 [112];
  ios_base local_168 [272];
  FloatFormat local_58;
  
  bVar28 = 0;
  pVVar4 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar5 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_4f0 = (double)((long)pVVar5 - (long)pVVar4 >> 4);
  local_578 = variables;
  local_4e8 = stmt;
  local_470 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_280,(size_t)local_4f0);
  local_218._M_p = (pointer)&local_208;
  local_250._0_4_ = GLSL_VERSION_300_ES;
  local_250._8_8_ = (pointer)0x0;
  local_250._16_8_ = (pointer)0x0;
  local_250._24_8_ = (pointer)0x0;
  local_250._32_8_ = (pointer)0x0;
  local_250._40_8_ = (pointer)0x0;
  local_250._48_8_ = (pointer)0x0;
  local_210 = 0;
  local_208._M_local_buf[0] = '\0';
  local_1f8._M_p = (pointer)&local_1e8;
  local_1f0 = 0;
  local_1e8._M_local_buf[0] = '\0';
  local_58.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_58.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_58.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_58.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_58.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_58.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_58.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_58.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_58._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2c0._M_impl.super__Rb_tree_header._M_header;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_468._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_468 + 8);
  local_2c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Statement: ",0xb);
  (*local_4e8->_vptr_Statement[2])(local_4e8,poVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_570 = pVVar4;
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  p_Var1 = (_Rb_tree_node_base *)(local_550 + 8);
  local_550._8_4_ = _S_red;
  local_540._0_8_ = (_Base_ptr)0x0;
  local_528 = 0.0;
  local_540._8_8_ = p_Var1;
  local_540._16_8_ = p_Var1;
  (*local_4e8->_vptr_Statement[4])(local_4e8,local_550);
  if ((_Rb_tree_node_base *)local_540._8_8_ != p_Var1) {
    p_Var15 = (_Rb_tree_node_base *)local_540._8_8_;
    do {
      (**(code **)(**(long **)(p_Var15 + 1) + 0x30))(*(long **)(p_Var15 + 1),local_1d8);
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != p_Var1);
  }
  if (local_528 != 0.0) {
    local_468._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_468 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,(char *)local_4d8._0_8_,local_4d8._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
      operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_3f0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_550);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
  std::ios_base::~ios_base(local_168);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_468,"precision ",10);
  pcVar16 = glu::getPrecisionName((this->m_ctx).precision);
  if (pcVar16 == (char *)0x0) {
    std::ios::clear((int)((long)&local_578 + *(long *)(local_468._0_8_ + -0x18)) + 0x110);
  }
  else {
    sVar17 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_468,pcVar16,sVar17);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_468," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_218,(string *)local_1d8);
  pcVar7 = local_1d8 + 0x10;
  if ((pointer)local_1d8._0_8_ != pcVar7) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
  std::ios_base::~ios_base(local_3f8);
  type.super_ApiType.m_bits = (ApiType)(*((this->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_250._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((this->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                   "#extension ",&this->m_extension);
    plVar18 = (long *)std::__cxx11::string::append(local_1d8);
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar18 == paVar23) {
      local_458._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_458._8_8_ = plVar18[3];
      local_468._0_8_ = &local_458;
    }
    else {
      local_458._M_allocated_capacity = paVar23->_M_allocated_capacity;
      local_468._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar18;
    }
    local_468._8_8_ = plVar18[1];
    *plVar18 = (long)paVar23;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_218,(string *)local_468);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._0_8_ != &local_458) {
      operator_delete((void *)local_468._0_8_,local_458._M_allocated_capacity + 1);
    }
    if ((pointer)local_1d8._0_8_ != pcVar7) {
      operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_250 + 8),3);
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_468,this,
             (local_578->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar12 = local_250._8_8_;
  std::__cxx11::string::operator=((string *)(local_250._8_8_ + 0x70),(string *)local_468);
  glu::VarType::operator=(&((pointer)(uVar12 + 0x70))->varType,(VarType *)&local_448);
  glu::VarType::~VarType((VarType *)&local_448);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._0_8_ != &local_458) {
    operator_delete((void *)local_468._0_8_,local_458._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_468,this,
             (local_578->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar12 = local_250._8_8_;
  std::__cxx11::string::operator=((string *)(local_250._8_8_ + 0x38),(string *)local_468);
  glu::VarType::operator=(&((pointer)(uVar12 + 0x38))->varType,(VarType *)&local_448);
  glu::VarType::~VarType((VarType *)&local_448);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._0_8_ != &local_458) {
    operator_delete((void *)local_468._0_8_,local_458._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_468,this,
             (local_578->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar12 = local_250._8_8_;
  std::__cxx11::string::operator=((string *)local_250._8_8_,(string *)local_468);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_448);
  glu::VarType::~VarType((VarType *)&local_448);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._0_8_ != &local_458) {
    operator_delete((void *)local_468._0_8_,local_458._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_250 + 0x20),1);
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_468,this,
             (local_578->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar12 = local_250._32_8_;
  std::__cxx11::string::operator=((string *)local_250._32_8_,(string *)local_468);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_448);
  glu::VarType::~VarType((VarType *)&local_448);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468._0_8_ != &local_458) {
    operator_delete((void *)local_468._0_8_,local_458._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_468);
  (*local_4e8->_vptr_Statement[2])(local_4e8,local_468);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_468);
  std::ios_base::~ios_base(local_3f8);
  std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1d8);
  if ((pointer)local_1d8._0_8_ != pcVar7) {
    operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
  }
  pSVar19 = ShaderExecUtil::createExecutor
                      ((this->m_ctx).renderContext,(this->m_ctx).shaderType,(ShaderSpec *)local_250)
  ;
  local_468._0_8_ =
       (local_470->in0).
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_468._8_8_ =
       (local_470->in1).
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_458._M_allocated_capacity =
       (size_type)
       (local_470->in2).
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_458._8_8_ =
       (local_470->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1d8._0_8_ =
       local_280.out0.
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1d8._8_8_ =
       local_280.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar19->_vptr_ShaderExecutor[3])
            (pSVar19,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar14 = (*pSVar19->_vptr_ShaderExecutor[2])(pSVar19);
  if ((char)iVar14 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar19->_vptr_ShaderExecutor[5])(pSVar19);
  (*pSVar19->_vptr_ShaderExecutor[6])(pSVar19,local_4f0,local_468,local_1d8);
  local_568 = &(this->m_ctx).floatFormat;
  local_558 = this;
  (*pSVar19->_vptr_ShaderExecutor[1])(pSVar19);
  pVVar9 = local_578;
  lVar20 = 0x10;
  do {
    auStack_478[lVar20] = 0;
    *(undefined8 *)((long)&local_470 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_468 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x70);
  lVar20 = 0x10;
  do {
    auStack_478[lVar20] = 0;
    *(undefined8 *)((long)&local_470 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_468 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x70);
  lVar20 = 0x10;
  do {
    local_1e8._M_local_buf[lVar20] = '\0';
    *(undefined8 *)(local_1d8 + lVar20 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1d8 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x70);
  lVar20 = 0x10;
  do {
    local_1e8._M_local_buf[lVar20] = '\0';
    *(undefined8 *)(local_1d8 + lVar20 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1d8 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x70);
  lVar20 = 0x10;
  do {
    auStack_560[lVar20] = 0;
    *(undefined8 *)((long)&local_558 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_550 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x70);
  lVar20 = 0x10;
  do {
    auStack_560[lVar20] = 0;
    *(undefined8 *)((long)&local_558 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_550 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x70);
  lVar20 = 0x10;
  do {
    *(undefined1 *)((long)&local_4e8 + lVar20) = 0;
    *(undefined8 *)((long)&local_4e0 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_4d8 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x70);
  lVar20 = 0x10;
  do {
    *(undefined1 *)((long)&local_4e8 + lVar20) = 0;
    *(undefined8 *)((long)&local_4e0 + lVar20) = 0x7ff0000000000000;
    *(undefined8 *)(local_4d8 + lVar20) = 0xfff0000000000000;
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x70);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2c0,
             (local_578->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_468);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2c0,
             (pVVar9->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_1d8);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2c0,
             (pVVar9->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_550);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2c0,
             (pVVar9->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_2e0);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2c0,
             (pVVar9->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_4d8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2c0,
             (pVVar9->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_559);
  if (pVVar5 == local_570) {
    local_4e0 = 0;
  }
  else {
    local_288 = &local_558->m_status;
    local_290 = (long)local_4f0 + (ulong)(local_4f0 == 0.0);
    uVar27 = 0;
    local_4e0 = 0;
    do {
      lVar20 = 0x10;
      do {
        local_1e8._M_local_buf[lVar20] = '\0';
        *(undefined8 *)(local_1d8 + lVar20 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_1d8 + lVar20) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x70);
      lVar20 = 0x10;
      do {
        local_1e8._M_local_buf[lVar20] = '\0';
        *(undefined8 *)(local_1d8 + lVar20 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_1d8 + lVar20) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x70);
      if ((uVar27 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_558->super_TestCase).super_TestNode.m_testCtx);
      }
      pIVar11 = local_470;
      local_570 = (pointer)(uVar27 * 0x10);
      puVar25 = (undefined8 *)
                ((long)local_570->m_data +
                (long)(local_470->in0).
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      local_4d8._0_8_ = *puVar25;
      local_4d8._8_8_ = puVar25[1];
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_550,local_568,(Vector<float,_4> *)local_4d8);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_468,local_568,(IVal *)local_550);
      pIVar21 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2c0,
                           (local_578->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      puVar25 = (undefined8 *)local_468;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(undefined8 *)pIVar21->m_data = *puVar25;
        puVar25 = puVar25 + (ulong)bVar28 * -2 + 1;
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      puVar25 = (undefined8 *)
                ((long)local_570->m_data +
                (long)(pIVar11->in1).
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      local_4d8._0_8_ = *puVar25;
      local_4d8._8_8_ = puVar25[1];
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_550,local_568,(Vector<float,_4> *)local_4d8);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_468,local_568,(IVal *)local_550);
      pIVar21 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2c0,
                           (local_578->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      puVar25 = (undefined8 *)local_468;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(undefined8 *)pIVar21->m_data = *puVar25;
        puVar25 = puVar25 + (ulong)bVar28 * -2 + 1;
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      puVar25 = (undefined8 *)
                ((long)local_570->m_data +
                (long)(pIVar11->in2).
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      local_4d8._0_8_ = *puVar25;
      local_4d8._8_8_ = puVar25[1];
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_550,local_568,(Vector<float,_4> *)local_4d8);
      pVVar9 = local_578;
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_468,local_568,(IVal *)local_550);
      pIVar21 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2c0,
                           (pVVar9->in2).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      puVar25 = (undefined8 *)local_468;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(undefined8 *)pIVar21->m_data = *puVar25;
        puVar25 = puVar25 + (ulong)bVar28 * -2 + 1;
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2c0,
                 (pVVar9->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_440.basic.type = (local_558->m_ctx).precision;
      local_448 = local_568->m_maxValue;
      local_468._0_8_ = *(undefined8 *)local_568;
      local_468._8_8_ = *(undefined8 *)&local_568->m_fractionBits;
      local_458._M_allocated_capacity = *(undefined8 *)&local_568->m_hasInf;
      local_458._8_8_ = *(undefined8 *)&local_568->m_exactPrecision;
      local_430 = 0;
      local_440._8_8_ = &local_2c0;
      (*local_4e8->_vptr_Statement[3])(local_4e8,local_468);
      pIVar21 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2c0,
                           (pVVar9->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_468,&local_58,pIVar21);
      pIVar21 = (IVal *)local_468;
      pIVar26 = (IVal *)local_1d8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        uVar8 = *(undefined7 *)&pIVar21->m_data[0].field_0x1;
        pIVar26->m_data[0].m_hasNaN = pIVar21->m_data[0].m_hasNaN;
        *(undefined7 *)&pIVar26->m_data[0].field_0x1 = uVar8;
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar28 * -2 + 1) * 8);
        pIVar26 = (IVal *)((long)pIVar26 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      bVar13 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         ((IVal *)local_1d8,
                          (Vector<float,_4> *)
                          ((long)local_570->m_data +
                          (long)(local_280.out0.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_data));
      local_468._0_8_ = &local_458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_468,"Shader output 0 is outside acceptable range","");
      bVar13 = tcu::ResultCollector::check(local_288,bVar13,(string *)local_468);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._0_8_ != &local_458) {
        operator_delete((void *)local_468._0_8_,(ulong)(local_458._M_allocated_capacity + 1));
      }
      uVar22 = (int)local_4e0 + ((byte)~bVar13 & 1);
      local_4e0 = (ulong)uVar22;
      if ((int)uVar22 < 0x65 && !bVar13) {
        local_468._0_8_ = ((local_558->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_468 + 8));
        pcVar16 = "Failed";
        if (bVar13) {
          pcVar16 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),pcVar16,6);
        pIVar11 = local_470;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8)," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\t",1);
        pVVar6 = (local_578->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                 .m_ptr;
        pVVar24 = (Vector<float,_4> *)local_540;
        pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
        local_550._0_8_ = pVVar24;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_550,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_550._0_8_,
                   CONCAT44(local_550._12_4_,local_550._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)local_4d8,(BuiltinPrecisionTests *)&local_58,
                   (FloatFormat *)
                   ((long)local_570->m_data +
                   (long)(pIVar11->in0).
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start),pVVar24);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_4d8._0_8_,local_4d8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\n",1);
        if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
          operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
        }
        if ((Vector<float,_4> *)local_550._0_8_ != (Vector<float,_4> *)local_540) {
          operator_delete((void *)local_550._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_540._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\t",1);
        pVVar6 = (local_578->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                 .m_ptr;
        pVVar24 = (Vector<float,_4> *)local_540;
        pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
        local_550._0_8_ = pVVar24;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_550,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_550._0_8_,
                   CONCAT44(local_550._12_4_,local_550._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)local_4d8,(BuiltinPrecisionTests *)&local_58,
                   (FloatFormat *)
                   ((long)local_570->m_data +
                   (long)(pIVar11->in1).
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start),pVVar24);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_4d8._0_8_,local_4d8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\n",1);
        if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
          operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
        }
        if ((Vector<float,_4> *)local_550._0_8_ != (Vector<float,_4> *)local_540) {
          operator_delete((void *)local_550._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_540._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8),"\t",1);
        pVVar6 = (local_578->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                 .m_ptr;
        pVVar24 = (Vector<float,_4> *)local_540;
        pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
        local_550._0_8_ = pVVar24;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_550,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_468 + 8),(char *)local_550._0_8_,
                   CONCAT44(local_550._12_4_,local_550._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_468 + 8)," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)local_4d8,(BuiltinPrecisionTests *)&local_58,
                   (FloatFormat *)
                   ((long)local_570->m_data +
                   (long)(pIVar11->in2).
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start),pVVar24);
        poVar3 = (ostream *)(local_468 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(char *)local_4d8._0_8_,local_4d8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
          operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
        }
        if ((Vector<float,_4> *)local_550._0_8_ != (Vector<float,_4> *)local_540) {
          operator_delete((void *)local_550._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_540._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
        pVVar6 = (local_578->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                 .m_ptr;
        pIVar21 = (IVal *)local_540;
        pcVar7 = (pVVar6->m_name)._M_dataplus._M_p;
        local_550._0_8_ = pIVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_550,pcVar7,pcVar7 + (pVVar6->m_name)._M_string_length);
        poVar3 = (ostream *)(local_468 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(char *)local_550._0_8_,CONCAT44(local_550._12_4_,local_550._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)local_4d8,(BuiltinPrecisionTests *)&local_58,
                   (FloatFormat *)
                   ((long)(local_280.out0.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data +
                   (long)local_570->m_data),(Vector<float,_4> *)pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(char *)local_4d8._0_8_,local_4d8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,4>>
                  (&local_2e0,(BuiltinPrecisionTests *)&local_58,(FloatFormat *)local_1d8,pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,local_2e0._M_dataplus._M_p,local_2e0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
          operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
        }
        if ((IVal *)local_550._0_8_ != (IVal *)local_540) {
          operator_delete((void *)local_550._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_540._0_8_ + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_468 + 8));
        std::ios_base::~ios_base(local_3f0);
      }
      uVar27 = uVar27 + 1;
    } while (uVar27 != local_290);
  }
  pPVar10 = local_558;
  iVar14 = (int)local_4e0;
  if (100 < iVar14) {
    local_468._0_8_ = ((local_558->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_468 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(Skipped ",9);
    std::ostream::operator<<(poVar2,iVar14 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_3f0);
  }
  if (iVar14 == 0) {
    local_468._0_8_ = ((pPVar10->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_468 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_468._0_8_ = ((pPVar10->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_468 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::ostream::operator<<(poVar2,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_468 + 8));
  std::ios_base::~ios_base(local_3f0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_p != &local_1e8) {
    operator_delete(local_1f8._M_p,
                    CONCAT71(local_1e8._M_allocated_capacity._1_7_,local_1e8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_p != &local_208) {
    operator_delete(local_218._M_p,
                    CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_250 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_250 + 8));
  if (local_280.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_280.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_280.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_280.out0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_280.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_280.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_280.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}